

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O3

PrimInfoMB *
embree::avx::createPrimRefArrayMSMBlur
          (PrimInfoMB *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  undefined8 uVar1;
  BBox1f BVar2;
  Geometry *pGVar3;
  Ref<embree::Geometry> *pRVar4;
  unsigned_long uVar5;
  size_t sVar6;
  size_t sVar7;
  BBox1f BVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  task *ptVar12;
  unsigned_long uVar13;
  runtime_error *prVar14;
  ulong uVar15;
  ulong uVar16;
  unsigned_long uVar17;
  long lVar18;
  ulong uVar19;
  size_t sVar20;
  undefined8 *puVar21;
  _func_int **pp_Var22;
  size_t sVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  _func_int **pp_Var29;
  bool bVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 in_register_00001208 [56];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  undefined1 auVar45 [16];
  range<unsigned_long> rVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  size_t taskCount;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_4e21;
  _func_int **local_4e20;
  BBox1f local_4e18;
  long **local_4e10;
  task_traits local_4e08;
  mvector<PrimRefMB> *local_4e00;
  Scene **local_4df8;
  BuildProgressMonitor *local_4df0;
  size_t local_4de8;
  mvector<PrimRefMB> **local_4de0;
  Scene **local_4dd8;
  Scene *local_4dd0;
  GTypeMask local_4dc8;
  undefined1 local_4dc0;
  mvector<PrimRefMB> *local_4db8;
  BBox1f *local_4db0;
  undefined4 local_4da8;
  undefined4 uStack_4da4;
  undefined4 uStack_4da0;
  undefined4 uStack_4d9c;
  undefined4 local_4d98;
  undefined4 uStack_4d94;
  undefined4 uStack_4d90;
  undefined4 uStack_4d8c;
  undefined4 local_4d88;
  undefined4 uStack_4d84;
  undefined4 uStack_4d80;
  undefined4 uStack_4d7c;
  undefined4 local_4d78;
  undefined4 uStack_4d74;
  undefined4 uStack_4d70;
  undefined4 uStack_4d6c;
  undefined4 local_4d68;
  undefined4 uStack_4d64;
  undefined4 uStack_4d60;
  undefined4 uStack_4d5c;
  undefined4 local_4d58;
  undefined4 uStack_4d54;
  undefined4 uStack_4d50;
  undefined4 uStack_4d4c;
  unsigned_long local_4d48;
  unsigned_long uStack_4d40;
  size_t sStack_4d38;
  size_t sStack_4d30;
  float local_4d28;
  float fStack_4d24;
  float fStack_4d20;
  float local_4d1c;
  long *local_4d18;
  _func_int ***local_4d10;
  undefined4 *local_4d08;
  Scene ***local_4d00;
  undefined1 *local_4cf8;
  mvector<PrimRefMB> ***local_4cf0;
  undefined8 local_4ce8;
  undefined4 local_4ce0;
  wait_context local_4cd8;
  task_group_context local_4cc8;
  long local_4c48 [64];
  ulong local_4a48 [64];
  _func_int **local_4848;
  ulong local_4840;
  undefined1 local_4838 [9352];
  undefined8 auStack_23b0 [1136];
  
  auVar47._8_56_ = in_register_00001208;
  auVar47._0_8_ = t0t1;
  local_4e18 = (BBox1f)vmovlps_avx(auVar47._0_16_);
  local_4848 = (_func_int **)0x0;
  local_4dc0 = 1;
  uVar19 = 0;
  local_4e00 = prims;
  local_4df0 = progressMonitor;
  local_4de8 = numPrimRefs;
  local_4dd0 = scene;
  local_4dc8 = types;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar23 = (scene->geometries).size_active;
  if (sVar23 != 0) {
    uVar19 = 0;
    sVar20 = 0;
    do {
      pGVar3 = (scene->geometries).items[sVar20].ptr;
      if ((((pGVar3 == (Geometry *)0x0) || (((uint)pGVar3->field_8 >> 0x15 & 1) == 0)) ||
          ((1 << (SUB41(pGVar3->field_8,0) & 0x1f) & types) == ~MTY_ALL)) ||
         (pGVar3->numTimeSteps == 1)) {
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)pGVar3->numPrimitives;
      }
      uVar19 = uVar19 + uVar15;
      sVar20 = sVar20 + 1;
    } while (sVar23 != sVar20);
  }
  local_4840 = uVar19;
  iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar15 = uVar19 + 0x3ff >> 10;
  if ((ulong)(long)iVar10 < uVar15) {
    uVar15 = (long)iVar10;
  }
  uVar27 = 0x40;
  if (uVar15 < 0x40) {
    uVar27 = uVar15;
  }
  pp_Var29 = (_func_int **)(uVar27 + (uVar27 == 0));
  local_4c48[0] = 0;
  local_4a48[0] = 0;
  local_4848 = pp_Var29;
  if (1 < uVar15) {
    uVar27 = 0;
    uVar15 = uVar19 / (ulong)pp_Var29;
    pRVar4 = (scene->geometries).items;
    pp_Var22 = (_func_int **)0x1;
    lVar24 = 0;
    do {
      pGVar3 = pRVar4[lVar24].ptr;
      if (((pGVar3 == (Geometry *)0x0) || (((uint)pGVar3->field_8 >> 0x15 & 1) == 0)) ||
         (((1 << (SUB41(pGVar3->field_8,0) & 0x1f) & types) == ~MTY_ALL ||
          ((pGVar3->numTimeSteps == 1 || (uVar26 = (ulong)pGVar3->numPrimitives, uVar26 == 0)))))) {
        uVar26 = 0;
        lVar18 = 0;
      }
      else {
        uVar16 = ((long)pp_Var22 + 1) * uVar19;
        lVar18 = 0;
        uVar28 = 0;
        do {
          uVar11 = uVar15;
          uVar15 = uVar11;
          if ((uVar27 + uVar26 + lVar18 < uVar11) || (pp_Var29 <= pp_Var22)) break;
          local_4c48[(long)pp_Var22] = lVar24;
          uVar28 = uVar28 + (uVar11 - uVar27);
          local_4a48[(long)pp_Var22] = uVar28;
          pp_Var22 = (_func_int **)((long)pp_Var22 + 1);
          uVar15 = uVar16 / (ulong)local_4848;
          lVar18 = -uVar28;
          uVar16 = uVar16 + uVar19;
          uVar27 = uVar11;
          pp_Var29 = local_4848;
        } while (uVar28 < uVar26);
      }
      uVar27 = uVar26 + uVar27 + lVar18;
      lVar24 = lVar24 + 1;
    } while (pp_Var22 < pp_Var29);
  }
  local_4da8 = 0x7f800000;
  uStack_4da4 = 0x7f800000;
  uStack_4da0 = 0x7f800000;
  uStack_4d9c = 0x7f800000;
  local_4d98 = 0xff800000;
  uStack_4d94 = 0xff800000;
  uStack_4d90 = 0xff800000;
  uStack_4d8c = 0xff800000;
  local_4d88 = 0x7f800000;
  uStack_4d84 = 0x7f800000;
  uStack_4d80 = 0x7f800000;
  uStack_4d7c = 0x7f800000;
  local_4d78 = 0xff800000;
  uStack_4d74 = 0xff800000;
  uStack_4d70 = 0xff800000;
  uStack_4d6c = 0xff800000;
  local_4d68 = 0x7f800000;
  uStack_4d64 = 0x7f800000;
  uStack_4d60 = 0x7f800000;
  uStack_4d5c = 0x7f800000;
  local_4d58 = 0xff800000;
  uStack_4d54 = 0xff800000;
  uStack_4d50 = 0xff800000;
  uStack_4d4c = 0xff800000;
  local_4d48 = 0;
  uStack_4d40 = 0;
  sStack_4d38 = 0;
  sStack_4d30 = 0;
  local_4d28 = 0.0;
  auVar52._8_4_ = 0x3f800000;
  auVar52._0_8_ = 0x3f8000003f800000;
  auVar52._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar52);
  fStack_4d24 = (float)uVar1;
  fStack_4d20 = (float)((ulong)uVar1 >> 0x20);
  local_4d1c = 0.0;
  local_4db8 = local_4e00;
  local_4db0 = &local_4e18;
  local_4df8 = &local_4dd0;
  local_4d00 = &local_4df8;
  local_4cf0 = &local_4de0;
  local_4d10 = &local_4e20;
  local_4d18 = local_4c48;
  local_4cf8 = &local_4e21;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4e20 = pp_Var29;
  local_4de0 = &local_4db8;
  local_4dd8 = local_4df8;
  local_4d08 = &local_4da8;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4e08.m_version_and_traits = 0;
  local_4e10 = &local_4d18;
  ptVar12 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e08,0xc0);
  ptVar12->m_reserved[2] = 0;
  ptVar12->m_reserved[3] = 0;
  ptVar12->m_reserved[4] = 0;
  ptVar12->m_reserved[5] = 0;
  (ptVar12->super_task_traits).m_version_and_traits = 0;
  ptVar12->m_reserved[0] = 0;
  ptVar12->m_reserved[1] = 0;
  ptVar12->m_reserved[2] = 0;
  ptVar12->_vptr_task = (_func_int **)&PTR__task_0219f2e8;
  ptVar12[1]._vptr_task = pp_Var29;
  ptVar12[1].super_task_traits.m_version_and_traits = 0;
  ptVar12[1].m_reserved[0] = 1;
  ptVar12[1].m_reserved[1] = (uint64_t)&local_4e10;
  ptVar12[1].m_reserved[2] = 0;
  ptVar12[1].m_reserved[3] = 1;
  iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  *(undefined4 *)&ptVar12[2]._vptr_task = 0;
  *(undefined1 *)((long)&ptVar12[2]._vptr_task + 4) = 5;
  ptVar12[1].m_reserved[5] = (long)iVar10 * 2 & 0x7ffffffffffffffe;
  ptVar12[2].super_task_traits.m_version_and_traits = local_4e08.m_version_and_traits;
  local_4ce8 = 0;
  local_4ce0 = 1;
  local_4cd8.m_version_and_traits = 1;
  local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  ptVar12[1].m_reserved[4] = (uint64_t)&local_4ce8;
  tbb::detail::r1::execute_and_wait(ptVar12,&local_4cc8,&local_4cd8,&local_4cc8);
  cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar9 != '\0') {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"task cancelled");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar31.m128[1] = (float)uStack_4da4;
  aVar31.m128[0] = (float)local_4da8;
  aVar31.m128[2] = (float)uStack_4da0;
  aVar31.m128[3] = (float)uStack_4d9c;
  aVar33.m128[1] = (float)uStack_4d94;
  aVar33.m128[0] = (float)local_4d98;
  aVar33.m128[2] = (float)uStack_4d90;
  aVar33.m128[3] = (float)uStack_4d8c;
  aVar35.m128[1] = (float)uStack_4d84;
  aVar35.m128[0] = (float)local_4d88;
  aVar35.m128[2] = (float)uStack_4d80;
  aVar35.m128[3] = (float)uStack_4d7c;
  aVar37.m128[1] = (float)uStack_4d74;
  aVar37.m128[0] = (float)local_4d78;
  aVar37.m128[2] = (float)uStack_4d70;
  aVar37.m128[3] = (float)uStack_4d6c;
  aVar39.m128[1] = (float)uStack_4d64;
  aVar39.m128[0] = (float)local_4d68;
  aVar39.m128[2] = (float)uStack_4d60;
  aVar39.m128[3] = (float)uStack_4d5c;
  aVar41.m128[1] = (float)uStack_4d54;
  aVar41.m128[0] = (float)local_4d58;
  aVar41.m128[2] = (float)uStack_4d50;
  aVar41.m128[3] = (float)uStack_4d4c;
  (__return_storage_ptr__->object_range)._begin = local_4d48;
  (__return_storage_ptr__->object_range)._end = uStack_4d40;
  BVar2.upper = fStack_4d24;
  BVar2.lower = local_4d28;
  BVar8.upper = local_4d1c;
  BVar8.lower = fStack_4d20;
  __return_storage_ptr__->num_time_segments = sStack_4d38;
  __return_storage_ptr__->max_num_time_segments = sStack_4d30;
  __return_storage_ptr__->max_time_range = BVar2;
  __return_storage_ptr__->time_range = BVar8;
  uVar13 = uStack_4d40;
  uVar17 = local_4d48;
  if (local_4e20 != (_func_int **)0x0) {
    sVar23 = __return_storage_ptr__->num_time_segments;
    sVar20 = __return_storage_ptr__->max_num_time_segments;
    pauVar25 = (undefined1 (*) [16])local_4838;
    auVar43._8_8_ = 0;
    auVar43._0_4_ = (__return_storage_ptr__->max_time_range).lower;
    auVar43._4_4_ = (__return_storage_ptr__->max_time_range).upper;
    auVar47 = ZEXT864((ulong)__return_storage_ptr__->time_range);
    pp_Var29 = local_4e20;
    do {
      uVar19 = *(ulong *)(pauVar25[7] + 8);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)pauVar25[8];
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x240) = aVar31;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x241) = aVar33;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x242) = aVar35;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x243) = aVar37;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x244) = aVar39;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar25 + 0x245) = aVar41;
      aVar31.m128 = (__m128)vminps_avx(aVar31.m128,*pauVar25);
      aVar33.m128 = (__m128)vmaxps_avx(aVar33.m128,pauVar25[1]);
      aVar35.m128 = (__m128)vminps_avx(aVar35.m128,pauVar25[2]);
      aVar37.m128 = (__m128)vmaxps_avx(aVar37.m128,pauVar25[3]);
      aVar39.m128 = (__m128)vminps_avx(aVar39.m128,pauVar25[4]);
      aVar41.m128 = (__m128)vmaxps_avx(aVar41.m128,pauVar25[5]);
      uVar17 = uVar17 + *(long *)pauVar25[6];
      uVar13 = uVar13 + *(long *)(pauVar25[6] + 8);
      sVar23 = sVar23 + *(long *)pauVar25[7];
      uVar5 = (__return_storage_ptr__->object_range)._end;
      sVar6 = __return_storage_ptr__->num_time_segments;
      sVar7 = __return_storage_ptr__->max_num_time_segments;
      *(unsigned_long *)pauVar25[0x246] = (__return_storage_ptr__->object_range)._begin;
      *(unsigned_long *)(pauVar25[0x246] + 8) = uVar5;
      *(size_t *)pauVar25[0x247] = sVar6;
      *(size_t *)(pauVar25[0x247] + 8) = sVar7;
      auVar45 = auVar47._0_16_;
      auVar52 = vmovlhps_avx(auVar43,auVar45);
      pauVar25[0x248] = auVar52;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)(pauVar25[8] + 8);
      auVar50 = vcmpps_avx(auVar45,auVar49,1);
      auVar44 = vinsertps_avx(auVar45,auVar49,0x50);
      auVar52 = vblendps_avx(auVar49,auVar45,2);
      auVar52 = vblendvps_avx(auVar52,auVar44,auVar50);
      auVar47 = ZEXT1664(auVar52);
      bVar30 = sVar20 < uVar19;
      if (sVar20 <= uVar19) {
        sVar20 = uVar19;
      }
      auVar50 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar19 >> 8),bVar30)),0x50);
      auVar50 = vpslld_avx(auVar50,0x1f);
      auVar43 = vblendvps_avx(auVar43,auVar48,auVar50);
      (__return_storage_ptr__->object_range)._begin = uVar17;
      (__return_storage_ptr__->object_range)._end = uVar13;
      __return_storage_ptr__->num_time_segments = sVar23;
      __return_storage_ptr__->max_num_time_segments = sVar20;
      pauVar25 = pauVar25 + 9;
      pp_Var29 = (_func_int **)((long)pp_Var29 + -1);
    } while (pp_Var29 != (_func_int **)0x0);
    auVar52 = vmovlhps_avx(auVar43,auVar52);
    (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar52._0_8_;
    (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar52._0_8_ >> 0x20);
    (__return_storage_ptr__->time_range).lower = (float)(int)auVar52._8_8_;
    (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar52._8_8_ >> 0x20);
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar33;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar35;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar37;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar39;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar41;
  if (uVar13 - uVar17 != local_4de8) {
    (**local_4df0->_vptr_BuildProgressMonitor)(local_4df0,0);
    pp_Var29 = local_4848;
    local_4da8 = 0x7f800000;
    uStack_4da4 = 0x7f800000;
    uStack_4da0 = 0x7f800000;
    uStack_4d9c = 0x7f800000;
    local_4d98 = 0xff800000;
    uStack_4d94 = 0xff800000;
    uStack_4d90 = 0xff800000;
    uStack_4d8c = 0xff800000;
    local_4d88 = 0x7f800000;
    uStack_4d84 = 0x7f800000;
    uStack_4d80 = 0x7f800000;
    uStack_4d7c = 0x7f800000;
    local_4d78 = 0xff800000;
    uStack_4d74 = 0xff800000;
    uStack_4d70 = 0xff800000;
    uStack_4d6c = 0xff800000;
    local_4d68 = 0x7f800000;
    uStack_4d64 = 0x7f800000;
    uStack_4d60 = 0x7f800000;
    uStack_4d5c = 0x7f800000;
    local_4d58 = 0xff800000;
    uStack_4d54 = 0xff800000;
    uStack_4d50 = 0xff800000;
    uStack_4d4c = 0xff800000;
    local_4d48 = 0;
    uStack_4d40 = 0;
    sStack_4d38 = 0;
    sStack_4d30 = 0;
    local_4d28 = 0.0;
    auVar50._8_4_ = 0x3f800000;
    auVar50._0_8_ = 0x3f8000003f800000;
    auVar50._12_4_ = 0x3f800000;
    uVar1 = vmovlps_avx(auVar50);
    fStack_4d24 = (float)uVar1;
    fStack_4d20 = (float)((ulong)uVar1 >> 0x20);
    local_4d1c = 0.0;
    local_4db8 = local_4e00;
    local_4db0 = &local_4e18;
    local_4df8 = &local_4dd0;
    local_4e20 = local_4848;
    local_4d18 = local_4c48;
    local_4d10 = &local_4e20;
    local_4d00 = &local_4df8;
    local_4cf8 = &local_4e21;
    local_4cf0 = &local_4de0;
    local_4cc8.my_version = proxy_support;
    local_4cc8.my_traits = (context_traits)0x4;
    local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_4cc8.my_name = CUSTOM_CTX;
    local_4de0 = &local_4db8;
    local_4dd8 = local_4df8;
    local_4d08 = &local_4da8;
    tbb::detail::r1::initialize(&local_4cc8);
    local_4e10 = &local_4d18;
    if (pp_Var29 != (_func_int **)0x0) {
      local_4e08.m_version_and_traits = 0;
      ptVar12 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e08,0xc0);
      ptVar12->m_reserved[2] = 0;
      ptVar12->m_reserved[3] = 0;
      ptVar12->m_reserved[4] = 0;
      ptVar12->m_reserved[5] = 0;
      (ptVar12->super_task_traits).m_version_and_traits = 0;
      ptVar12->m_reserved[0] = 0;
      ptVar12->m_reserved[1] = 0;
      ptVar12->m_reserved[2] = 0;
      ptVar12->_vptr_task = (_func_int **)&PTR__task_0219f330;
      ptVar12[1]._vptr_task = pp_Var29;
      ptVar12[1].super_task_traits.m_version_and_traits = 0;
      ptVar12[1].m_reserved[0] = 1;
      ptVar12[1].m_reserved[1] = (uint64_t)&local_4e10;
      ptVar12[1].m_reserved[2] = 0;
      ptVar12[1].m_reserved[3] = 1;
      iVar10 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar12[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar12[2]._vptr_task + 4) = 5;
      ptVar12[1].m_reserved[5] = (long)iVar10 * 2 & 0x7ffffffffffffffe;
      ptVar12[2].super_task_traits.m_version_and_traits = local_4e08.m_version_and_traits;
      local_4ce8 = 0;
      local_4ce0 = 1;
      local_4cd8.m_version_and_traits = 1;
      local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar12[1].m_reserved[4] = (uint64_t)&local_4ce8;
      tbb::detail::r1::execute_and_wait(ptVar12,&local_4cc8,&local_4cd8,&local_4cc8);
    }
    cVar9 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
    if (cVar9 != '\0') {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar14,"task cancelled");
      __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_4cc8);
    aVar32.m128[1] = (float)uStack_4da4;
    aVar32.m128[0] = (float)local_4da8;
    aVar32.m128[2] = (float)uStack_4da0;
    aVar32.m128[3] = (float)uStack_4d9c;
    aVar34.m128[1] = (float)uStack_4d94;
    aVar34.m128[0] = (float)local_4d98;
    aVar34.m128[2] = (float)uStack_4d90;
    aVar34.m128[3] = (float)uStack_4d8c;
    aVar36.m128[1] = (float)uStack_4d84;
    aVar36.m128[0] = (float)local_4d88;
    aVar36.m128[2] = (float)uStack_4d80;
    aVar36.m128[3] = (float)uStack_4d7c;
    aVar38.m128[1] = (float)uStack_4d74;
    aVar38.m128[0] = (float)local_4d78;
    aVar38.m128[2] = (float)uStack_4d70;
    aVar38.m128[3] = (float)uStack_4d6c;
    aVar40.m128[1] = (float)uStack_4d64;
    aVar40.m128[0] = (float)local_4d68;
    aVar40.m128[2] = (float)uStack_4d60;
    aVar40.m128[3] = (float)uStack_4d5c;
    aVar42.m128[1] = (float)uStack_4d54;
    aVar42.m128[0] = (float)local_4d58;
    aVar42.m128[2] = (float)uStack_4d50;
    aVar42.m128[3] = (float)uStack_4d4c;
    rVar46._end = uStack_4d40;
    rVar46._begin = local_4d48;
    auVar44._4_4_ = fStack_4d24;
    auVar44._0_4_ = local_4d28;
    auVar44._8_8_ = 0;
    auVar47 = ZEXT464((uint)fStack_4d20);
    if (local_4e20 != (_func_int **)0x0) {
      auVar52 = vinsertps_avx(ZEXT416((uint)fStack_4d20),ZEXT416((uint)local_4d1c),0x10);
      auVar47 = ZEXT1664(auVar52);
      puVar21 = auStack_23b0;
      sVar23 = sStack_4d30;
      do {
        uVar19 = puVar21[-0x482];
        auVar45._8_8_ = 0;
        auVar45._0_8_ = puVar21[-0x481];
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar21 + -0x11) = aVar32;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar21 + -0xf) = aVar34;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar21 + -0xd) = aVar36;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar21 + -0xb) = aVar38;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar21 + -9) = aVar40;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar21 + -7) = aVar42;
        *(range<unsigned_long> *)(puVar21 + -5) = rVar46;
        puVar21[-3] = sStack_4d38;
        puVar21[-2] = sVar23;
        uVar1 = vmovlps_avx(auVar44);
        puVar21[-1] = uVar1;
        aVar32.m128 = (__m128)vminps_avx(aVar32.m128,*(undefined1 (*) [16])(puVar21 + -0x491));
        aVar34.m128 = (__m128)vmaxps_avx(aVar34.m128,*(undefined1 (*) [16])(puVar21 + -0x48f));
        aVar36.m128 = (__m128)vminps_avx(aVar36.m128,*(undefined1 (*) [16])(puVar21 + -0x48d));
        aVar38.m128 = (__m128)vmaxps_avx(aVar38.m128,*(undefined1 (*) [16])(puVar21 + -0x48b));
        aVar40.m128 = (__m128)vminps_avx(aVar40.m128,*(undefined1 (*) [16])(puVar21 + -0x489));
        aVar42.m128 = (__m128)vmaxps_avx(aVar42.m128,*(undefined1 (*) [16])(puVar21 + -0x487));
        rVar46 = (range<unsigned_long>)
                 vpaddq_avx((undefined1  [16])rVar46,*(undefined1 (*) [16])(puVar21 + -0x485));
        sStack_4d38 = sStack_4d38 + puVar21[-0x483];
        auVar51._8_8_ = 0;
        auVar51._0_8_ = puVar21[-0x480];
        auVar52 = auVar47._0_16_;
        uVar1 = vmovlps_avx(auVar52);
        *puVar21 = uVar1;
        auVar43 = vcmpps_avx(auVar52,auVar51,1);
        auVar50 = vinsertps_avx(auVar52,auVar51,0x50);
        auVar52 = vblendps_avx(auVar51,auVar52,2);
        auVar52 = vblendvps_avx(auVar52,auVar50,auVar43);
        auVar47 = ZEXT1664(auVar52);
        sStack_4d30 = uVar19;
        if (uVar19 < sVar23) {
          sStack_4d30 = sVar23;
        }
        auVar52 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(sVar23 >> 8),sVar23 < uVar19)),0x50);
        auVar52 = vpslld_avx(auVar52,0x1f);
        auVar44 = vblendvps_avx(auVar44,auVar45,auVar52);
        puVar21 = puVar21 + 0x12;
        local_4e20 = (_func_int **)((long)local_4e20 + -1);
        sVar23 = sStack_4d30;
      } while (local_4e20 != (_func_int **)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar32;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar34;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar36;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar38;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar40;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar42;
    __return_storage_ptr__->object_range = rVar46;
    __return_storage_ptr__->num_time_segments = sStack_4d38;
    __return_storage_ptr__->max_num_time_segments = sStack_4d30;
    BVar2 = (BBox1f)vmovlps_avx(auVar44);
    __return_storage_ptr__->max_time_range = BVar2;
    (__return_storage_ptr__->time_range).lower = auVar47._0_4_;
  }
  __return_storage_ptr__->time_range = local_4e18;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1)
    {
      ParallelForForPrefixSumState<PrimInfoMB> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfoMB {
          return mesh->createPrimRefMBArray(prims,t0t1,r,k,(unsigned)geomID);
      }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            return mesh->createPrimRefMBArray(prims,t0t1,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      }

      /* the BVH starts with that time range, even though primitives might have smaller/larger time range */
      pinfo.time_range = t0t1;
      return pinfo;
    }